

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void set_vbp_thresholds(AV1_COMP *cpi,int64_t *thresholds,uint64_t blk_sad,int qindex,
                       int content_lowsumdiff,int source_sad_nonrd,int source_sad_rd,
                       _Bool is_segment_id_boosted,int lighting_change)

{
  int16_t iVar1;
  int iVar2;
  int iVar3;
  int num_pixels_00;
  long threshold_base_00;
  int64_t iVar4;
  uint64_t in_RDX;
  int64_t *in_RSI;
  AV1_COMP *in_RDI;
  int in_R9D;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  byte in_stack_00000010;
  undefined7 in_stack_00000011;
  int num_pixels;
  int threshold_left_shift;
  int current_qindex;
  int64_t threshold_base;
  int ac_q;
  int threshold_multiplier;
  int is_key_frame;
  AV1_COMMON *cm;
  aom_bit_depth_t in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  int source_sad_nonrd_00;
  undefined4 in_stack_ffffffffffffffc0;
  
  iVar2 = frame_is_intra_only(&in_RDI->common);
  iVar3 = 1;
  if (iVar2 != 0) {
    iVar3 = 0x78;
  }
  iVar1 = av1_ac_quant_QTX(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                           in_stack_ffffffffffffff98);
  threshold_base_00 = (long)(iVar3 * iVar1);
  iVar3 = (in_RDI->common).quant_params.base_qindex;
  source_sad_nonrd_00 = (in_RDI->sf).rt_sf.var_part_split_threshold_shift;
  num_pixels_00 = (in_RDI->common).width * (in_RDI->common).height;
  if (iVar2 == 0) {
    iVar4 = tune_base_thresh_content
                      ((AV1_COMP *)CONCAT44((int)iVar1,in_stack_ffffffffffffffc0),threshold_base_00,
                       iVar3,source_sad_nonrd_00,num_pixels_00);
    *in_RSI = iVar4 >> 1;
    in_RSI[1] = iVar4;
    in_RSI[3] = iVar4 << ((byte)source_sad_nonrd_00 & 0x3f);
    tune_thresh_based_on_resolution
              ((AV1_COMP *)threshold_base,(int64_t *)CONCAT44(current_qindex,threshold_left_shift),
               CONCAT71(in_stack_00000011,in_stack_00000010),in_stack_0000000c,in_stack_00000008,
               unaff_retaddr);
    tune_thresh_based_on_qindex
              (in_RDI,in_RSI,in_RDX,iVar3,num_pixels_00,(_Bool)(in_stack_00000010 & 1),in_R9D,
               threshold_left_shift);
  }
  else {
    set_vbp_thresholds_key_frame(in_RDI,in_RSI,threshold_base_00,source_sad_nonrd_00,num_pixels_00);
  }
  return;
}

Assistant:

static inline void set_vbp_thresholds(AV1_COMP *cpi, int64_t thresholds[],
                                      uint64_t blk_sad, int qindex,
                                      int content_lowsumdiff,
                                      int source_sad_nonrd, int source_sad_rd,
                                      bool is_segment_id_boosted,
                                      int lighting_change) {
  AV1_COMMON *const cm = &cpi->common;
  const int is_key_frame = frame_is_intra_only(cm);
  const int threshold_multiplier = is_key_frame ? 120 : 1;
  const int ac_q = av1_ac_quant_QTX(qindex, 0, cm->seq_params->bit_depth);
  int64_t threshold_base = (int64_t)(threshold_multiplier * ac_q);
  const int current_qindex = cm->quant_params.base_qindex;
  const int threshold_left_shift = cpi->sf.rt_sf.var_part_split_threshold_shift;
  const int num_pixels = cm->width * cm->height;

  if (is_key_frame) {
    set_vbp_thresholds_key_frame(cpi, thresholds, threshold_base,
                                 threshold_left_shift, num_pixels);
    return;
  }

  threshold_base = tune_base_thresh_content(
      cpi, threshold_base, content_lowsumdiff, source_sad_nonrd, num_pixels);
  thresholds[0] = threshold_base >> 1;
  thresholds[1] = threshold_base;
  thresholds[3] = threshold_base << threshold_left_shift;

  tune_thresh_based_on_resolution(cpi, thresholds, threshold_base,
                                  current_qindex, source_sad_rd, num_pixels);

  tune_thresh_based_on_qindex(cpi, thresholds, blk_sad, current_qindex,
                              num_pixels, is_segment_id_boosted,
                              source_sad_nonrd, lighting_change);
}